

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_quantize_avx.c
# Opt level: O2

void aom_quantize_b_32x32_avx
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  tran_low_t *ptVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar16 [64];
  __m128i dequant;
  __m128i dequant_00;
  __m128i dequant_01;
  __m128i dequant_02;
  __m128i zero;
  __m128i zero_00;
  __m128i zero_01;
  __m128i zero_02;
  __m128i qcoeff;
  __m128i qcoeff_00;
  __m128i qcoeff_01;
  __m128i qcoeff_02;
  tran_low_t *in_stack_ffffffffffffff08;
  undefined4 uStack_f0;
  int log_scale;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  intptr_t local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  longlong extraout_RDX;
  int16_t *extraout_RDX_00;
  longlong extraout_RDX_01;
  int16_t *extraout_RDX_02;
  
  log_scale = 1;
  auVar12._8_4_ = 0x10001;
  auVar12._0_8_ = 0x1000100010001;
  auVar12._12_4_ = 0x10001;
  auVar9 = vpaddw_avx(auVar12,*(undefined1 (*) [16])zbin_ptr);
  auVar14 = vpsrlw_avx(auVar9,1);
  auVar15 = vpcmpeqd_avx(in_ZMM9._0_16_,in_ZMM9._0_16_);
  auVar9 = vpaddw_avx(auVar12,*(undefined1 (*) [16])round_ptr);
  auVar10 = vpsrlw_avx(auVar9,1);
  auVar9 = *(undefined1 (*) [16])quant_ptr;
  local_e8 = *(undefined1 (*) [16])dequant_ptr;
  auVar12 = *(undefined1 (*) [16])quant_shift_ptr;
  auVar11 = vpackssdw_avx(*(undefined1 (*) [16])coeff_ptr,*(undefined1 (*) [16])(coeff_ptr + 4));
  auVar4 = vpackssdw_avx(*(undefined1 (*) [16])(coeff_ptr + 8),
                         *(undefined1 (*) [16])(coeff_ptr + 0xc));
  auVar2 = vpabsw_avx(auVar11);
  auVar3 = vpabsw_avx(auVar4);
  auVar5 = vpcmpgtw_avx(auVar14,auVar2);
  local_c8 = auVar15 ^ auVar5;
  auVar14 = vpshufd_avx(auVar14,0xee);
  local_58 = vpaddw_avx(auVar14,auVar15);
  local_b8 = vpcmpgtw_avx(auVar3,local_58);
  auVar15 = vpor_avx(local_b8,local_c8);
  local_90 = n_coeffs;
  if (auVar15 == (undefined1  [16])0x0) {
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    qcoeff_ptr[4] = 0;
    qcoeff_ptr[5] = 0;
    qcoeff_ptr[6] = 0;
    qcoeff_ptr[7] = 0;
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
    dqcoeff_ptr[4] = 0;
    dqcoeff_ptr[5] = 0;
    dqcoeff_ptr[6] = 0;
    dqcoeff_ptr[7] = 0;
    qcoeff_ptr[8] = 0;
    qcoeff_ptr[9] = 0;
    qcoeff_ptr[10] = 0;
    qcoeff_ptr[0xb] = 0;
    qcoeff_ptr[0xc] = 0;
    qcoeff_ptr[0xd] = 0;
    qcoeff_ptr[0xe] = 0;
    qcoeff_ptr[0xf] = 0;
    dqcoeff_ptr[8] = 0;
    dqcoeff_ptr[9] = 0;
    dqcoeff_ptr[10] = 0;
    dqcoeff_ptr[0xb] = 0;
    dqcoeff_ptr[0xc] = 0;
    dqcoeff_ptr[0xd] = 0;
    dqcoeff_ptr[0xe] = 0;
    dqcoeff_ptr[0xf] = 0;
    local_e8 = vpshufd_avx(local_e8,0xee);
    local_68 = vpshufd_avx(auVar10,0xee);
    local_78 = vpshufd_avx(auVar9,0xee);
    local_88 = vpshufd_avx(auVar12,0xee);
    auVar13 = ZEXT1664((undefined1  [16])0x0);
  }
  else {
    auVar2 = vpaddsw_avx(auVar2,auVar10);
    auVar15 = vpmulhw_avx(auVar9,auVar2);
    auVar2 = vpaddw_avx(auVar15,auVar2);
    auVar15 = vpmullw_avx(auVar2,auVar12);
    auVar2 = vpmulhw_avx(auVar2,auVar12);
    auVar15 = vpsrlw_avx(auVar15,0xf);
    auVar2 = vpaddw_avx(auVar2,auVar2);
    auVar15 = vpor_avx(auVar15,auVar2);
    local_68 = vpshufd_avx(auVar10,0xee);
    auVar2 = vpaddsw_avx(auVar3,local_68);
    local_78 = vpshufd_avx(auVar9,0xee);
    auVar9 = vpmulhw_avx(auVar2,local_78);
    auVar9 = vpaddw_avx(auVar9,auVar2);
    local_88 = vpshufd_avx(auVar12,0xee);
    auVar12 = vpmullw_avx(auVar9,local_88);
    auVar9 = vpmulhw_avx(auVar9,local_88);
    auVar12 = vpsrlw_avx(auVar12,0xf);
    auVar9 = vpaddw_avx(auVar9,auVar9);
    auVar9 = vpor_avx(auVar9,auVar12);
    auVar12 = vpsignw_avx(auVar15,auVar11);
    auVar9 = vpsignw_avx(auVar9,auVar4);
    local_a8 = vpandn_avx(auVar5,auVar12);
    local_d8 = vpand_avx(local_b8,auVar9);
    auVar9 = vpsraw_avx(local_a8,0xf);
    auVar12 = vpunpcklwd_avx(local_a8,auVar9);
    auVar9 = vpunpckhwd_avx(local_a8,auVar9);
    *(undefined1 (*) [16])qcoeff_ptr = auVar12;
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = auVar9;
    auVar9 = vpsraw_avx(local_d8,0xf);
    auVar12 = vpunpcklwd_avx(local_d8,auVar9);
    auVar9 = vpunpckhwd_avx(local_d8,auVar9);
    *(undefined1 (*) [16])(qcoeff_ptr + 8) = auVar12;
    *(undefined1 (*) [16])(qcoeff_ptr + 0xc) = auVar9;
    dequant[1] = (longlong)round_ptr;
    dequant[0] = (longlong)zbin_ptr;
    zero[1] = (longlong)quant_shift_ptr;
    zero[0] = (longlong)quant_ptr;
    qcoeff[1] = (longlong)&log_scale;
    qcoeff[0] = (longlong)dqcoeff_ptr;
    calculate_dqcoeff_and_store_log_scale
              (qcoeff,dequant,zero,in_stack_ffffffffffffff08,(int *)CONCAT44(1,uStack_f0));
    local_e8 = vpermilps_avx(local_e8,0xee);
    dequant_00[1] = (longlong)round_ptr;
    dequant_00[0] = extraout_RDX;
    zero_00[1] = (longlong)quant_shift_ptr;
    zero_00[0] = (longlong)quant_ptr;
    qcoeff_00[1] = (longlong)&log_scale;
    qcoeff_00[0] = (longlong)(dqcoeff_ptr + 8);
    calculate_dqcoeff_and_store_log_scale
              (qcoeff_00,dequant_00,zero_00,in_stack_ffffffffffffff08,
               (int *)CONCAT44(log_scale,uStack_f0));
    auVar12 = vpsubw_avx(*(undefined1 (*) [16])iscan,local_c8);
    auVar2 = vpsubw_avx(*(undefined1 (*) [16])(iscan + 8),local_b8);
    auVar9 = vpcmpeqw_avx((undefined1  [16])0x0,local_a8);
    auVar9 = vpandn_avx(auVar9,auVar12);
    auVar12 = vpcmpeqw_avx((undefined1  [16])0x0,local_d8);
    auVar12 = vpandn_avx(auVar12,auVar2);
    auVar9 = vpmaxsw_avx(auVar9,auVar12);
    auVar13 = ZEXT1664(auVar9);
    zbin_ptr = extraout_RDX_00;
  }
  auVar16 = ZEXT1664(local_58);
  lVar6 = 0x40;
  lVar8 = 0x60;
  for (lVar7 = 0x10; local_a8 = auVar13._0_16_, lVar7 < local_90; lVar7 = lVar7 + 0x10) {
    auVar2 = vpackssdw_avx(*(undefined1 (*) [16])(coeff_ptr + lVar7),
                           *(undefined1 (*) [16])(coeff_ptr + lVar7 + 4));
    auVar3 = vpackssdw_avx(*(undefined1 (*) [16])(coeff_ptr + lVar7 + 8),
                           *(undefined1 (*) [16])(coeff_ptr + lVar7 + 0xc));
    auVar9 = vpabsw_avx(auVar2);
    auVar12 = vpabsw_avx(auVar3);
    local_48 = vpcmpgtw_avx(auVar9,auVar16._0_16_);
    local_c8 = vpcmpgtw_avx(auVar12,auVar16._0_16_);
    auVar11 = vpor_avx(local_c8,local_48);
    if (auVar11 == (undefined1  [16])0x0) {
      ptVar1 = qcoeff_ptr + lVar7;
      ptVar1[0] = 0;
      ptVar1[1] = 0;
      ptVar1[2] = 0;
      ptVar1[3] = 0;
      ptVar1[4] = 0;
      ptVar1[5] = 0;
      ptVar1[6] = 0;
      ptVar1[7] = 0;
      ptVar1 = dqcoeff_ptr + lVar7;
      ptVar1[0] = 0;
      ptVar1[1] = 0;
      ptVar1[2] = 0;
      ptVar1[3] = 0;
      ptVar1[4] = 0;
      ptVar1[5] = 0;
      ptVar1[6] = 0;
      ptVar1[7] = 0;
      ptVar1 = qcoeff_ptr + lVar7 + 8;
      ptVar1[0] = 0;
      ptVar1[1] = 0;
      ptVar1[2] = 0;
      ptVar1[3] = 0;
      ptVar1[4] = 0;
      ptVar1[5] = 0;
      ptVar1[6] = 0;
      ptVar1[7] = 0;
      ptVar1 = dqcoeff_ptr + lVar7 + 8;
      ptVar1[0] = 0;
      ptVar1[1] = 0;
      ptVar1[2] = 0;
      ptVar1[3] = 0;
      ptVar1[4] = 0;
      ptVar1[5] = 0;
      ptVar1[6] = 0;
      ptVar1[7] = 0;
    }
    else {
      auVar9 = vpaddsw_avx(auVar9,local_68);
      auVar11 = vpmulhw_avx(auVar9,local_78);
      auVar9 = vpaddw_avx(auVar11,auVar9);
      auVar11 = vpmullw_avx(auVar9,local_88);
      auVar9 = vpmulhw_avx(auVar9,local_88);
      auVar11 = vpsrlw_avx(auVar11,0xf);
      auVar9 = vpaddw_avx(auVar9,auVar9);
      auVar11 = vpor_avx(auVar9,auVar11);
      auVar9 = vpaddsw_avx(auVar12,local_68);
      auVar12 = vpmulhw_avx(auVar9,local_78);
      auVar9 = vpaddw_avx(auVar12,auVar9);
      auVar12 = vpmullw_avx(auVar9,local_88);
      auVar9 = vpmulhw_avx(auVar9,local_88);
      auVar12 = vpsrlw_avx(auVar12,0xf);
      auVar9 = vpaddw_avx(auVar9,auVar9);
      auVar9 = vpor_avx(auVar9,auVar12);
      auVar12 = vpsignw_avx(auVar11,auVar2);
      auVar9 = vpsignw_avx(auVar9,auVar3);
      local_b8 = vpand_avx(local_48,auVar12);
      local_d8 = vpand_avx(local_c8,auVar9);
      auVar9 = vpsraw_avx(local_b8,0xf);
      auVar12 = vpunpcklwd_avx(local_b8,auVar9);
      auVar9 = vpunpckhwd_avx(local_b8,auVar9);
      *(undefined1 (*) [16])(qcoeff_ptr + lVar7) = auVar12;
      *(undefined1 (*) [16])(qcoeff_ptr + lVar7 + 4) = auVar9;
      auVar9 = vpsraw_avx(local_d8,0xf);
      auVar12 = vpunpcklwd_avx(local_d8,auVar9);
      auVar9 = vpunpckhwd_avx(local_d8,auVar9);
      *(undefined1 (*) [16])(qcoeff_ptr + lVar7 + 8) = auVar12;
      *(undefined1 (*) [16])(qcoeff_ptr + lVar7 + 0xc) = auVar9;
      dequant_01[1] = (longlong)round_ptr;
      dequant_01[0] = (longlong)zbin_ptr;
      zero_01[1] = (longlong)quant_shift_ptr;
      zero_01[0] = (longlong)quant_ptr;
      qcoeff_01[1] = (longlong)&log_scale;
      qcoeff_01[0] = (long)dqcoeff_ptr + lVar6;
      calculate_dqcoeff_and_store_log_scale
                (qcoeff_01,dequant_01,zero_01,in_stack_ffffffffffffff08,
                 (int *)CONCAT44(log_scale,uStack_f0));
      dequant_02[1] = (longlong)round_ptr;
      dequant_02[0] = extraout_RDX_01;
      zero_02[1] = (longlong)quant_shift_ptr;
      zero_02[0] = (longlong)quant_ptr;
      qcoeff_02[1] = (longlong)&log_scale;
      qcoeff_02[0] = (long)dqcoeff_ptr + lVar8;
      calculate_dqcoeff_and_store_log_scale
                (qcoeff_02,dequant_02,zero_02,in_stack_ffffffffffffff08,
                 (int *)CONCAT44(log_scale,uStack_f0));
      auVar16 = ZEXT1664(local_58);
      auVar12 = vpsubw_avx(*(undefined1 (*) [16])(iscan + lVar7),local_48);
      auVar2 = vpsubw_avx(*(undefined1 (*) [16])(iscan + lVar7 + 8),local_c8);
      auVar9 = vpcmpeqw_avx((undefined1  [16])0x0,local_b8);
      auVar9 = vpandn_avx(auVar9,auVar12);
      auVar12 = vpcmpeqw_avx((undefined1  [16])0x0,local_d8);
      auVar12 = vpandn_avx(auVar12,auVar2);
      auVar9 = vpmaxsw_avx(auVar9,auVar12);
      auVar9 = vpmaxsw_avx(local_a8,auVar9);
      auVar13 = ZEXT1664(auVar9);
      zbin_ptr = extraout_RDX_02;
    }
    lVar6 = lVar6 + 0x40;
    lVar8 = lVar8 + 0x40;
  }
  auVar9 = vpshufd_avx(local_a8,0xe);
  auVar9 = vpmaxsw_avx(local_a8,auVar9);
  auVar12 = vpshuflw_avx(auVar9,0xe);
  auVar9 = vpmaxsw_avx(auVar9,auVar12);
  auVar12 = vpshuflw_avx(auVar9,1);
  auVar9 = vpmaxsw_avx(auVar9,auVar12);
  vpextrw_avx(auVar9,1);
  return;
}

Assistant:

void aom_quantize_b_32x32_avx(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                              const int16_t *zbin_ptr, const int16_t *round_ptr,
                              const int16_t *quant_ptr,
                              const int16_t *quant_shift_ptr,
                              tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                              const int16_t *dequant_ptr, uint16_t *eob_ptr,
                              const int16_t *scan, const int16_t *iscan) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi16(1);
  const __m256i big_zero = _mm256_setzero_si256();
  int index;
  const int log_scale = 1;

  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1;
  __m128i all_zero;
  __m128i eob = zero, eob0;

  (void)scan;

  // Setup global values.
  // The 32x32 halves zbin and round.
  zbin = _mm_load_si128((const __m128i *)zbin_ptr);
  // Shift with rounding.
  zbin = _mm_add_epi16(zbin, one);
  zbin = _mm_srli_epi16(zbin, 1);
  // x86 has no "greater *or equal*" comparison. Subtract 1 from zbin so
  // it is a strict "greater" comparison.
  zbin = _mm_sub_epi16(zbin, one);

  round = _mm_load_si128((const __m128i *)round_ptr);
  round = _mm_add_epi16(round, one);
  round = _mm_srli_epi16(round, 1);

  quant = _mm_load_si128((const __m128i *)quant_ptr);
  dequant = _mm_load_si128((const __m128i *)dequant_ptr);
  shift = _mm_load_si128((const __m128i *)quant_shift_ptr);

  // Do DC and first 15 AC.
  coeff0 = load_tran_low(coeff_ptr);
  coeff1 = load_tran_low(coeff_ptr + 8);

  qcoeff0 = _mm_abs_epi16(coeff0);
  qcoeff1 = _mm_abs_epi16(coeff1);

  cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC.
  cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_test_all_zeros(all_zero, all_zero)) {
    _mm256_store_si256((__m256i *)(qcoeff_ptr), big_zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr), big_zero);
    _mm256_store_si256((__m256i *)(qcoeff_ptr + 8), big_zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr + 8), big_zero);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    calculate_qcoeff_log_scale(&qcoeff0, round, quant, &shift, &log_scale);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    calculate_qcoeff_log_scale(&qcoeff1, round, quant, &shift, &log_scale);

    // Reinsert signs.
    qcoeff0 = _mm_sign_epi16(qcoeff0, coeff0);
    qcoeff1 = _mm_sign_epi16(qcoeff1, coeff1);

    // Mask out zbin threshold coeffs.
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_tran_low(qcoeff0, qcoeff_ptr);
    store_tran_low(qcoeff1, qcoeff_ptr + 8);

    calculate_dqcoeff_and_store_log_scale(qcoeff0, dequant, zero, dqcoeff_ptr,
                                          &log_scale);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    calculate_dqcoeff_and_store_log_scale(qcoeff1, dequant, zero,
                                          dqcoeff_ptr + 8, &log_scale);

    eob =
        scan_for_eob(&qcoeff0, &qcoeff1, cmp_mask0, cmp_mask1, iscan, 0, zero);
  }

  // AC only loop.
  for (index = 16; index < n_coeffs; index += 16) {
    coeff0 = load_tran_low(coeff_ptr + index);
    coeff1 = load_tran_low(coeff_ptr + index + 8);

    qcoeff0 = _mm_abs_epi16(coeff0);
    qcoeff1 = _mm_abs_epi16(coeff1);

    cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_test_all_zeros(all_zero, all_zero)) {
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index), big_zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index), big_zero);
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index + 8), big_zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index + 8), big_zero);
      continue;
    }

    calculate_qcoeff_log_scale(&qcoeff0, round, quant, &shift, &log_scale);
    calculate_qcoeff_log_scale(&qcoeff1, round, quant, &shift, &log_scale);

    qcoeff0 = _mm_sign_epi16(qcoeff0, coeff0);
    qcoeff1 = _mm_sign_epi16(qcoeff1, coeff1);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_tran_low(qcoeff0, qcoeff_ptr + index);
    store_tran_low(qcoeff1, qcoeff_ptr + index + 8);

    calculate_dqcoeff_and_store_log_scale(qcoeff0, dequant, zero,
                                          dqcoeff_ptr + index, &log_scale);
    calculate_dqcoeff_and_store_log_scale(qcoeff1, dequant, zero,
                                          dqcoeff_ptr + index + 8, &log_scale);

    eob0 = scan_for_eob(&qcoeff0, &qcoeff1, cmp_mask0, cmp_mask1, iscan, index,
                        zero);
    eob = _mm_max_epi16(eob, eob0);
  }

  *eob_ptr = accumulate_eob(eob);
}